

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-feeder-c-impl.h
# Opt level: O2

void __thiscall
mp::NLW2_NLFeeder_C_Impl::FeedFixedVarNames<mp::StringFileWriter>
          (NLW2_NLFeeder_C_Impl *this,StringFileWriter *wrt)

{
  bool bVar1;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  if ((this->nlf2_c_).want_fixed_var_names_ != 0) {
    bVar1 = StringFileWriter::operator_cast_to_bool(wrt);
    if (bVar1) {
      local_30._8_8_ = 0;
      local_18 = std::
                 _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/api/c/nl-feeder-c-impl.h:459:13)>
                 ::_M_invoke;
      local_20 = std::
                 _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/api/c/nl-feeder-c-impl.h:459:13)>
                 ::_M_manager;
      local_30._M_unused._M_object = wrt;
      (*(this->nlf2_c_).FeedFixedVarNames)((this->nlf2_c_).p_user_data_,&local_30);
      std::_Function_base::~_Function_base((_Function_base *)&local_30);
    }
  }
  return;
}

Assistant:

void FeedFixedVarNames(FixedVarNameWriter& wrt) {
    assert(NLF().FeedFixedVarNames);
    if (NLF().want_fixed_var_names_ && wrt) {
      std::function<void(const char*, const char*)> wrt_c
          = [&wrt](const char* name, const char* comment) {
        wrt << typename FixedVarNameWriter::StrStrValue
        { name, comment };
      };
      NLF().FeedFixedVarNames(NLF().p_user_data_, &wrt_c);
    }
  }